

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtable.cpp
# Opt level: O3

SymTable *
SymTable::from_script(SymTable *__return_storage_ptr__,Script *script,ProgramContext *program)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(__return_storage_ptr__->scripts)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->scripts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->global_vars)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->global_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->global_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->global_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->global_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->global_vars)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->constants)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->constants)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  (__return_storage_ptr__->constants)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->constants)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->constants)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  memset(&(__return_storage_ptr__->constants)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,
         0xb4);
  scan_symbols(__return_storage_ptr__,script,program);
  return __return_storage_ptr__;
}

Assistant:

auto SymTable::from_script(Script& script, ProgramContext& program) -> SymTable
{
    SymTable symbols;
    symbols.scan_symbols(script, program);
    return symbols;
}